

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

Mat * __thiscall ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _c)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  Mat local_88;
  ulong local_50;
  long local_48;
  Mat *local_40;
  Mat *local_38;
  
  uVar9 = (ulong)(uint)_c;
  iVar11 = this->c;
  local_88.w = this->h * this->w * iVar11;
  iVar12 = _h * _w;
  if (local_88.w == iVar12 * _c) {
    iVar1 = this->dims;
    local_48 = (long)iVar12;
    local_40 = __return_storage_ptr__;
    if (iVar1 < 3) {
      local_50 = this->elemsize;
      uVar4 = (local_50 * local_48 + 0xf & 0xfffffffffffffff0) / local_50;
      if ((long)_h * (long)_w - uVar4 != 0) {
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->elemsize = local_50;
        __return_storage_ptr__->dims = 3;
        __return_storage_ptr__->w = _w;
        __return_storage_ptr__->h = _h;
        __return_storage_ptr__->c = _c;
        __return_storage_ptr__->cstep = uVar4;
        if ((long)_c * uVar4 == 0) {
          pvVar7 = (void *)0x0;
        }
        else {
          lVar8 = (long)_c * uVar4 * local_50;
          pvVar5 = malloc(lVar8 + 0x1c);
          pvVar7 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar7 - 8) = pvVar5;
          __return_storage_ptr__->data = pvVar7;
          __return_storage_ptr__->refcount = (int *)((long)pvVar7 + lVar8);
          *(undefined4 *)((long)pvVar7 + lVar8) = 1;
        }
        lVar8 = local_48;
        if (_c < 1) {
          return local_40;
        }
        lVar6 = uVar4 * local_50;
        iVar11 = 0;
        lVar10 = 0;
        local_38 = this;
        do {
          memcpy((void *)(lVar6 * lVar10 + (long)pvVar7),
                 (void *)(local_38->elemsize * (long)iVar11 + (long)local_38->data),
                 local_38->elemsize * lVar8);
          lVar10 = lVar10 + 1;
          iVar11 = iVar11 + iVar12;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        return local_40;
      }
    }
    else {
      if (iVar11 != _c) {
        if ((iVar1 == 3) && (this->cstep != (long)this->h * (long)this->w)) {
          local_88.elemsize = this->elemsize;
          local_88.data = (void *)0x0;
          local_88.refcount = (int *)0x0;
          local_88.dims = 1;
          local_88.h = 1;
          local_88.c = 1;
          local_88.cstep = (size_t)local_88.w;
          if (local_88.w != 0) {
            lVar8 = local_88.elemsize * local_88.cstep;
            pvVar7 = malloc(lVar8 + 0x1c);
            local_88.data = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)local_88.data + -8) = pvVar7;
            local_88.refcount = (int *)((long)local_88.data + lVar8);
            *(undefined4 *)((long)local_88.data + lVar8) = 1;
            iVar11 = this->c;
          }
          pvVar7 = local_88.data;
          if (0 < iVar11) {
            lVar8 = 0;
            do {
              sVar3 = this->elemsize;
              iVar11 = this->h * this->w;
              memcpy((void *)((long)((int)lVar8 * iVar11) * sVar3 + (long)pvVar7),
                     (void *)(this->cstep * lVar8 * sVar3 + (long)this->data),(long)iVar11 * sVar3);
              lVar8 = lVar8 + 1;
            } while (lVar8 < this->c);
          }
        }
        else {
          local_88.data = this->data;
          local_88.refcount = this->refcount;
          local_88.elemsize = this->elemsize;
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + 1;
            UNLOCK();
          }
          local_88.dims = 1;
          local_88.h = 1;
          local_88.c = 1;
          local_88.cstep = (size_t)local_88.w;
        }
        reshape(__return_storage_ptr__,&local_88,_w,_h,_c);
        if (local_88.refcount == (int *)0x0) {
          return local_40;
        }
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount != 0) {
          return local_40;
        }
        if (local_88.data == (void *)0x0) {
          return local_40;
        }
        free(*(void **)((long)local_88.data + -8));
        return local_40;
      }
      local_50 = this->elemsize;
    }
    __return_storage_ptr__->data = this->data;
    piVar2 = this->refcount;
    __return_storage_ptr__->refcount = piVar2;
    __return_storage_ptr__->elemsize = local_50;
    __return_storage_ptr__->dims = iVar1;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
      local_50 = this->elemsize;
    }
    __return_storage_ptr__->dims = 3;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep = (local_48 * local_50 + 0xf & 0xfffffffffffffff0) / local_50;
  }
  else {
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c);
        return tmp.reshape(_w, _h, _c);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}